

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O3

bool anon_unknown.dwarf_157a427::SubConditionHelper
               (unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                *out,Value *value,cmJSONState *state)

{
  _Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  _Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false> _Var4;
  _Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false> local_30;
  
  local_30._M_head_impl = (Condition *)0x0;
  bVar2 = ConditionHelper((unique_ptr<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
                           *)&local_30,value,state);
  _Var1._M_head_impl = local_30._M_head_impl;
  if ((local_30._M_head_impl == (Condition *)0x0) ||
     (iVar3 = (*(local_30._M_head_impl)->_vptr_Condition[3])(local_30._M_head_impl),
     (char)iVar3 == '\0')) {
    _Var4._M_head_impl =
         (out->_M_t).
         super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
         .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl;
    (out->_M_t).
    super___uniq_ptr_impl<cmCMakePresetsGraph::Condition,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCMakePresetsGraph::Condition_*,_std::default_delete<cmCMakePresetsGraph::Condition>_>
    .super__Head_base<0UL,_cmCMakePresetsGraph::Condition_*,_false>._M_head_impl =
         _Var1._M_head_impl;
    if (_Var4._M_head_impl == (Condition *)0x0) {
      return bVar2;
    }
  }
  else {
    cmCMakePresetsErrors::INVALID_CONDITION(value,state);
    bVar2 = false;
    _Var4._M_head_impl = _Var1._M_head_impl;
  }
  (*(_Var4._M_head_impl)->_vptr_Condition[1])(_Var4._M_head_impl);
  return bVar2;
}

Assistant:

bool SubConditionHelper(std::unique_ptr<cmCMakePresetsGraph::Condition>& out,
                        const Json::Value* value, cmJSONState* state)
{
  std::unique_ptr<cmCMakePresetsGraph::Condition> ptr;
  auto result = ConditionHelper(ptr, value, state);
  if (ptr && ptr->IsNull()) {
    cmCMakePresetsErrors::INVALID_CONDITION(value, state);
    return false;
  }
  out = std::move(ptr);
  return result;
}